

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O2

pid_t __thiscall Container::start(Container *this)

{
  int iVar1;
  void *pvVar2;
  
  pvVar2 = operator_new__(0x800000);
  iVar1 = clone(clone_callback,(void *)((long)pvVar2 + 0x800000),0x68020411,this);
  this->pid_ = iVar1;
  operator_delete__(pvVar2);
  return this->pid_;
}

Assistant:

pid_t Container::start() {
    const size_t clone_stack_size = 8 * 1024 * 1024;
    char *clone_stack = new char[clone_stack_size];
    // SIGCHLD - send SIGCHLD on exit
    // CLONE_FILES - share file descriptors table
    // CLONE_NEWIPC - create new ipc namespace to prevent any forms of communication
    // CLONE_NEWNET - create new network namespace to block network
    // CLONE_NEWNS - create new mount namespace (used for safety reasons)
    // CLONE_NEWPID - create new pid namespace to hide other processes
    pid_ = clone(
        clone_callback,
        clone_stack + clone_stack_size,
        SIGCHLD | CLONE_FILES | CLONE_NEWIPC | CLONE_NEWNET | CLONE_NEWNS | CLONE_NEWPID,
        this
    );
    delete[] clone_stack;

    return pid_;
}